

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_Skip_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_Skip_Test *this)

{
  TestInfo *pTVar1;
  bool bVar2;
  char *__s;
  TestResult *this_00;
  allocator<char> local_1c1;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  memset((iuStreamMessage *)local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_190,(int *)&local_1c0);
  if (((iutest::Test::Observer<void>::s_current == (Test *)0x0) ||
      (iutest::Test::Observer<void>::s_current->m_test_info == (iuITestInfoMediator *)0x0)) ||
     (pTVar1 = iutest::Test::Observer<void>::s_current->m_test_info->m_test_info,
     pTVar1 == (TestInfo *)0x0)) {
    if (*(long *)(iutest::UnitTestImpl::ptr()::ptr + 0x10) == 0) {
      this_00 = (TestResult *)(iutest::UnitTestImpl::ptr()::ptr + 0x38);
    }
    else {
      this_00 = (TestResult *)(*(long *)(iutest::UnitTestImpl::ptr()::ptr + 0x10) + 0x78);
    }
  }
  else {
    this_00 = &pTVar1->m_test_result;
  }
  bVar2 = iutest::TestResult::Failed(this_00);
  if (bVar2) {
    __s = "Skipped. but already failed. ";
  }
  else {
    __s = "Skipped. ";
    if ((iutest::Test::Observer<void>::s_current != (Test *)0x0) &&
       (pTVar1 = iutest::Test::Observer<void>::s_current->m_test_info->m_test_info,
       pTVar1 != (TestInfo *)0x0)) {
      pTVar1->m_skip = true;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,__s,&local_1c1);
  local_1c0.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
  ;
  local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x1bf;
  local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffe;
  iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                  local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
      &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                             _4_4_,local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._0_4_),
                    local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  return;
}

Assistant:

TEST(GTestSyntaxTest, Skip)
{
    if( int x = 1 )
        GTEST_SKIP() << x;
}